

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,initializer_list<std::complex<float>_> *list)

{
  ulong uVar1;
  iterator pcVar2;
  complex<float> *__s;
  long lVar3;
  
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<float>_>,&PTR_PTR_01654270,list->_M_len,1);
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01653fb8;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  uVar1 = list->_M_len;
  if (uVar1 == 0) {
    __s = this->fElem;
  }
  else {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    memset(__s,0,uVar1 * 8);
    this->fElem = __s;
  }
  pcVar2 = list->_M_array;
  for (lVar3 = 0; uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)((long)&__s->_M_value + lVar3) = *(undefined8 *)((long)&pcVar2->_M_value + lVar3)
    ;
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}